

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ResizeIfLoadIsOutOfRange
          (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,size_type new_size)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  map_index_t new_num_buckets;
  
  uVar1 = (this->super_UntypedMapBase).num_buckets_;
  uVar4 = (ulong)(uVar1 & 0xfffffffe) - (ulong)(uVar1 >> 2 & 0xfffffffc);
  if (uVar4 < new_size) {
    if (-1 < (int)uVar1) {
      new_num_buckets = uVar1 * 2;
LAB_001c28de:
      Resize(this,new_num_buckets);
      return true;
    }
  }
  else if (2 < uVar1 && new_size <= uVar4 >> 2) {
    bVar2 = 0;
    do {
      bVar2 = bVar2 + 1;
    } while ((new_size * 5 >> 2) + 1 << (bVar2 & 0x3f) < uVar4);
    uVar3 = uVar1 >> (bVar2 & 0x1f);
    new_num_buckets = 2;
    if (2 < uVar3) {
      new_num_buckets = uVar3;
    }
    if (new_num_buckets != uVar1) goto LAB_001c28de;
  }
  return false;
}

Assistant:

bool ResizeIfLoadIsOutOfRange(size_type new_size) {
    const size_type hi_cutoff = CalculateHiCutoff(num_buckets_);
    const size_type lo_cutoff = hi_cutoff / 4;
    // We don't care how many elements are in trees.  If a lot are,
    // we may resize even though there are many empty buckets.  In
    // practice, this seems fine.
    if (PROTOBUF_PREDICT_FALSE(new_size > hi_cutoff)) {
      if (num_buckets_ <= max_size() / 2) {
        Resize(num_buckets_ * 2);
        return true;
      }
    } else if (PROTOBUF_PREDICT_FALSE(new_size <= lo_cutoff &&
                                      num_buckets_ > kMinTableSize)) {
      size_type lg2_of_size_reduction_factor = 1;
      // It's possible we want to shrink a lot here... size() could even be 0.
      // So, estimate how much to shrink by making sure we don't shrink so
      // much that we would need to grow the table after a few inserts.
      const size_type hypothetical_size = new_size * 5 / 4 + 1;
      while ((hypothetical_size << lg2_of_size_reduction_factor) < hi_cutoff) {
        ++lg2_of_size_reduction_factor;
      }
      size_type new_num_buckets = std::max<size_type>(
          kMinTableSize, num_buckets_ >> lg2_of_size_reduction_factor);
      if (new_num_buckets != num_buckets_) {
        Resize(new_num_buckets);
        return true;
      }
    }
    return false;
  }